

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  bool bVar2;
  int iVar3;
  ImFont *font;
  ImGuiWindow *pIVar4;
  ImGuiWindow **ppIVar5;
  float fVar6;
  float local_68;
  bool local_61;
  float local_60;
  float local_5c;
  float local_58;
  ImVec2 local_50;
  ImGuiWindow *local_48;
  ImGuiWindow *window_1;
  int i_1;
  float memory_compact_start_time;
  ImGuiWindow *window;
  int local_24;
  float fStack_20;
  int i;
  float local_18;
  float fStack_14;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdfc,"void ImGui::NewFrame()");
  }
  local_10 = GImGui;
  NewFrameSanityChecks();
  if ((local_10->SettingsLoaded & 1U) == 0) {
    bVar2 = ImChunkStream<ImGuiWindowSettings>::empty(&local_10->SettingsWindows);
    if (!bVar2) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xe09,"void ImGui::NewFrame()");
    }
    if ((local_10->IO).IniFilename != (char *)0x0) {
      LoadIniSettingsFromDisk((local_10->IO).IniFilename);
    }
    local_10->SettingsLoaded = true;
  }
  if ((0.0 < local_10->SettingsDirtyTimer) &&
     (local_10->SettingsDirtyTimer = local_10->SettingsDirtyTimer - (local_10->IO).DeltaTime,
     local_10->SettingsDirtyTimer <= 0.0)) {
    if ((local_10->IO).IniFilename == (char *)0x0) {
      (local_10->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk((local_10->IO).IniFilename);
    }
    local_10->SettingsDirtyTimer = 0.0;
  }
  local_10->Time = (double)(local_10->IO).DeltaTime + local_10->Time;
  local_10->WithinFrameScope = true;
  local_10->FrameCount = local_10->FrameCount + 1;
  local_10->TooltipOverrideCount = 0;
  local_10->WindowsActiveCount = 0;
  ((local_10->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  bVar2 = ImFont::IsLoaded(local_10->Font);
  if (!bVar2) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xe26,"void ImGui::NewFrame()");
  }
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffe0,0.0,0.0,(local_10->IO).DisplaySize.x,
                 (local_10->IO).DisplaySize.y);
  (local_10->DrawListSharedData).ClipRectFullscreen.x = fStack_20;
  (local_10->DrawListSharedData).ClipRectFullscreen.y = (float)i;
  (local_10->DrawListSharedData).ClipRectFullscreen.z = local_18;
  (local_10->DrawListSharedData).ClipRectFullscreen.w = fStack_14;
  (local_10->DrawListSharedData).CurveTessellationTol = (local_10->Style).CurveTessellationTol;
  (local_10->DrawListSharedData).InitialFlags = 0;
  if (((local_10->Style).AntiAliasedLines & 1U) != 0) {
    (local_10->DrawListSharedData).InitialFlags = (local_10->DrawListSharedData).InitialFlags | 1;
  }
  if (((local_10->Style).AntiAliasedFill & 1U) != 0) {
    (local_10->DrawListSharedData).InitialFlags = (local_10->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_10->IO).BackendFlags & 8U) != 0) {
    (local_10->DrawListSharedData).InitialFlags = (local_10->DrawListSharedData).InitialFlags | 4;
  }
  ImDrawList::Clear(&local_10->BackgroundDrawList);
  ImDrawList::PushTextureID(&local_10->BackgroundDrawList,((local_10->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(&local_10->BackgroundDrawList);
  ImDrawList::Clear(&local_10->ForegroundDrawList);
  ImDrawList::PushTextureID(&local_10->ForegroundDrawList,((local_10->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(&local_10->ForegroundDrawList);
  ImDrawData::Clear(&local_10->DrawData);
  if (((local_10->DragDropActive & 1U) != 0) &&
     ((local_10->DragDropPayload).SourceId == local_10->ActiveId)) {
    KeepAliveID((local_10->DragDropPayload).SourceId);
  }
  if (local_10->HoveredIdPreviousFrame == 0) {
    local_10->HoveredIdTimer = 0.0;
  }
  if ((local_10->HoveredIdPreviousFrame == 0) ||
     ((local_10->HoveredId != 0 && (local_10->ActiveId == local_10->HoveredId)))) {
    local_10->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_10->HoveredId != 0) {
    local_10->HoveredIdTimer = (local_10->IO).DeltaTime + local_10->HoveredIdTimer;
  }
  if ((local_10->HoveredId != 0) && (local_10->ActiveId != local_10->HoveredId)) {
    local_10->HoveredIdNotActiveTimer = (local_10->IO).DeltaTime + local_10->HoveredIdNotActiveTimer
    ;
  }
  local_10->HoveredIdPreviousFrame = local_10->HoveredId;
  local_10->HoveredId = 0;
  local_10->HoveredIdAllowOverlap = false;
  if (((local_10->ActiveIdIsAlive != local_10->ActiveId) &&
      (local_10->ActiveIdPreviousFrame == local_10->ActiveId)) && (local_10->ActiveId != 0)) {
    ClearActiveID();
  }
  if (local_10->ActiveId != 0) {
    local_10->ActiveIdTimer = (local_10->IO).DeltaTime + local_10->ActiveIdTimer;
  }
  local_10->LastActiveIdTimer = (local_10->IO).DeltaTime + local_10->LastActiveIdTimer;
  local_10->ActiveIdPreviousFrame = local_10->ActiveId;
  local_10->ActiveIdPreviousFrameWindow = local_10->ActiveIdWindow;
  local_10->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_10->ActiveIdHasBeenEditedBefore & 1);
  local_10->ActiveIdIsAlive = 0;
  local_10->ActiveIdHasBeenEditedThisFrame = false;
  local_10->ActiveIdPreviousFrameIsAlive = false;
  local_10->ActiveIdIsJustActivated = false;
  if ((local_10->TempInputTextId != 0) && (local_10->ActiveId != local_10->TempInputTextId)) {
    local_10->TempInputTextId = 0;
  }
  if (local_10->ActiveId == 0) {
    local_10->ActiveIdUsingNavInputMask = 0;
    local_10->ActiveIdUsingNavDirMask = 0;
    local_10->ActiveIdUsingKeyInputMask = 0;
  }
  local_10->DragDropAcceptIdPrev = local_10->DragDropAcceptIdCurr;
  local_10->DragDropAcceptIdCurr = 0;
  local_10->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_10->DragDropWithinSourceOrTarget = false;
  memcpy((local_10->IO).KeysDownDurationPrev,(local_10->IO).KeysDownDuration,0x800);
  for (local_24 = 0; local_24 < 0x200; local_24 = local_24 + 1) {
    if (((local_10->IO).KeysDown[local_24] & 1U) == 0) {
      local_5c = -1.0;
    }
    else {
      pfVar1 = (local_10->IO).KeysDownDuration + local_24;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_58 = (local_10->IO).KeysDownDuration[local_24] + (local_10->IO).DeltaTime;
      }
      else {
        local_58 = 0.0;
      }
      local_5c = local_58;
    }
    (local_10->IO).KeysDownDuration[local_24] = local_5c;
  }
  NavUpdate();
  UpdateMouseInputs();
  local_10->FramerateSecPerFrameAccum =
       ((local_10->IO).DeltaTime - local_10->FramerateSecPerFrame[local_10->FramerateSecPerFrameIdx]
       ) + local_10->FramerateSecPerFrameAccum;
  local_10->FramerateSecPerFrame[local_10->FramerateSecPerFrameIdx] = (local_10->IO).DeltaTime;
  local_10->FramerateSecPerFrameIdx = (local_10->FramerateSecPerFrameIdx + 1) % 0x78;
  if (local_10->FramerateSecPerFrameAccum <= 0.0) {
    local_60 = 3.4028235e+38;
  }
  else {
    local_60 = 1.0 / (local_10->FramerateSecPerFrameAccum / 120.0);
  }
  (local_10->IO).Framerate = local_60;
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar4 = GetTopMostPopupModal();
  if ((pIVar4 != (ImGuiWindow *)0x0) ||
     ((local_10->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_10->NavWindowingHighlightAlpha)))) {
    fVar6 = ImMin<float>((local_10->IO).DeltaTime * 6.0 + local_10->DimBgRatio,1.0);
    local_10->DimBgRatio = fVar6;
  }
  else {
    fVar6 = ImMax<float>(-(local_10->IO).DeltaTime * 10.0 + local_10->DimBgRatio,0.0);
    local_10->DimBgRatio = fVar6;
  }
  local_10->MouseCursor = 0;
  local_10->WantTextInputNextFrame = -1;
  local_10->WantCaptureKeyboardNextFrame = -1;
  local_10->WantCaptureMouseNextFrame = -1;
  ImVec2::ImVec2((ImVec2 *)((long)&window + 4),1.0,1.0);
  local_10->PlatformImePos = stack0xffffffffffffffd4;
  UpdateMouseWheel();
  local_61 = false;
  if ((((local_10->NavWindow != (ImGuiWindow *)0x0) &&
       (local_61 = false, (local_10->NavWindow->Active & 1U) != 0)) &&
      (local_61 = false, (local_10->NavWindow->Flags & 0x40000U) == 0)) &&
     (local_61 = false, ((local_10->IO).KeyCtrl & 1U) == 0)) {
    local_61 = IsKeyPressedMap(0,true);
  }
  local_10->FocusTabPressed = local_61;
  if ((local_10->ActiveId == 0) && ((local_10->FocusTabPressed & 1U) != 0)) {
    local_10->FocusRequestNextWindow = local_10->NavWindow;
    local_10->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((local_10->NavId == 0) || (local_10->NavIdTabCounter == 0x7fffffff)) {
      iVar3 = 0;
      if (((local_10->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      local_10->FocusRequestNextCounterTabStop = iVar3;
    }
    else {
      iVar3 = 1;
      if (((local_10->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      local_10->FocusRequestNextCounterTabStop = local_10->NavIdTabCounter + 1 + iVar3;
    }
  }
  local_10->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  local_10->FocusRequestCurrCounterTabStop = 0x7fffffff;
  local_10->FocusRequestCurrCounterRegular = 0x7fffffff;
  if (local_10->FocusRequestNextWindow != (ImGuiWindow *)0x0) {
    _i_1 = local_10->FocusRequestNextWindow;
    local_10->FocusRequestCurrWindow = _i_1;
    if ((local_10->FocusRequestNextCounterRegular != 0x7fffffff) &&
       ((_i_1->DC).FocusCounterRegular != -1)) {
      iVar3 = ImModPositive(local_10->FocusRequestNextCounterRegular,
                            (_i_1->DC).FocusCounterRegular + 1);
      local_10->FocusRequestCurrCounterRegular = iVar3;
    }
    if ((local_10->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       ((_i_1->DC).FocusCounterTabStop != -1)) {
      iVar3 = ImModPositive(local_10->FocusRequestNextCounterTabStop,
                            (_i_1->DC).FocusCounterTabStop + 1);
      local_10->FocusRequestCurrCounterTabStop = iVar3;
    }
    local_10->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    local_10->FocusRequestNextCounterTabStop = 0x7fffffff;
    local_10->FocusRequestNextCounterRegular = 0x7fffffff;
  }
  local_10->NavIdTabCounter = 0x7fffffff;
  if ((local_10->WindowsFocusOrder).Size == (local_10->Windows).Size) {
    if ((local_10->IO).ConfigWindowsMemoryCompactTimer < 0.0) {
      local_68 = 3.4028235e+38;
    }
    else {
      local_68 = (float)local_10->Time - (local_10->IO).ConfigWindowsMemoryCompactTimer;
    }
    window_1._4_4_ = local_68;
    for (window_1._0_4_ = 0; (int)window_1 != (local_10->Windows).Size;
        window_1._0_4_ = (int)window_1 + 1) {
      ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window_1);
      local_48 = *ppIVar5;
      local_48->WasActive = (bool)(local_48->Active & 1);
      local_48->BeginCount = 0;
      local_48->Active = false;
      local_48->WriteAccessed = false;
      if ((((local_48->WasActive & 1U) == 0) && ((local_48->MemoryCompacted & 1U) == 0)) &&
         (local_48->LastTimeActive < window_1._4_4_)) {
        GcCompactTransientWindowBuffers(local_48);
      }
    }
    if ((local_10->NavWindow != (ImGuiWindow *)0x0) && ((local_10->NavWindow->WasActive & 1U) == 0))
    {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&local_10->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&local_10->BeginPopupStack,0);
    ClosePopupsOverWindow(local_10->NavWindow,false);
    UpdateDebugToolItemPicker();
    ImVec2::ImVec2(&local_50,400.0,400.0);
    SetNextWindowSize(&local_50,4);
    Begin("Debug##Default",(bool *)0x0,0);
    local_10->WithinFrameScopeWithImplicitWindow = true;
    return;
  }
  __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0xeab,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTabStop = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterRegular = g.FocusRequestCurrCounterTabStop = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.FocusRequestCurrCounterRegular = ImModPositive(g.FocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.FocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.FocusRequestCurrCounterTabStop = ImModPositive(g.FocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterRegular = g.FocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.WithinFrameScopeWithImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}